

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spell.cpp
# Opt level: O0

void Handlers::Spell_Target_Group(Character *character,PacketReader *reader)

{
  World *pWVar1;
  bool bVar2;
  uint ts;
  int iVar3;
  mapped_type *this;
  int *piVar4;
  int iVar5;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  ESF_Data *local_60;
  ESF_Data *spell;
  allocator<char> local_41;
  key_type local_40;
  Timestamp local_1c;
  PacketReader *pPStack_18;
  Timestamp timestamp;
  PacketReader *reader_local;
  Character *character_local;
  
  pPStack_18 = reader;
  PacketReader::GetShort(reader);
  ts = PacketReader::GetThree(pPStack_18);
  Timestamp::Timestamp(&local_1c,ts);
  if ((character->spell_event != (TimeEvent *)0x0) || ((character->spell_ready & 1U) != 0)) {
    character->spell_target = TargetGroup;
    character->spell_target_id = 0;
    pWVar1 = character->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EnforceTimestamps",&local_41);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_40);
    bVar2 = util::variant::operator_cast_to_bool(this);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar2) {
      local_60 = ESF::Get(character->world->esf,(uint)character->spell_id);
      local_64 = (character->timestamp).ts;
      iVar3 = Timestamp::operator-(&local_1c,(Timestamp)local_64);
      bVar2 = true;
      if ((int)((local_60->cast_time - 1) * 0x2f + 0x23) <= iVar3) {
        local_68 = (character->timestamp).ts;
        iVar3 = Timestamp::operator-(&local_1c,(Timestamp)local_68);
        local_6c = (uint)local_60->cast_time;
        local_70 = 1;
        piVar4 = std::max<int>((int *)&local_6c,&local_70);
        iVar5 = *piVar4 * 0x32;
        bVar2 = iVar3 != iVar5 && SBORROW4(iVar3,iVar5) == iVar3 + *piVar4 * -0x32 < 0;
      }
      if (bVar2) {
        Character::CancelSpell(character);
        return;
      }
    }
    (character->timestamp).ts = local_1c.ts;
    if ((character->spell_ready & 1U) != 0) {
      Character::SpellAct(character);
    }
  }
  return;
}

Assistant:

void Spell_Target_Group(Character *character, PacketReader &reader)
{
	/*unsigned short spell_id = */reader.GetShort();
	Timestamp timestamp = reader.GetThree();

	if (!character->spell_event && !character->spell_ready)
		return;

	character->spell_target = Character::TargetGroup;
	character->spell_target_id = 0;

	if (character->world->config["EnforceTimestamps"])
	{
		const ESF_Data& spell = character->world->esf->Get(character->spell_id);

		if (timestamp - character->timestamp < (spell.cast_time - 1) * 47 + 35
		 || timestamp - character->timestamp > std::max<int>(spell.cast_time, 1) * 50)
		{
			character->CancelSpell();
			return;
		}
	}

	character->timestamp = timestamp;

	if (character->spell_ready)
		character->SpellAct();
}